

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::changeRange
          (SPxSolverBase<double> *this,VectorBase<double> *newLhs,VectorBase<double> *newRhs,
          bool scale)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  
  this->m_nonbasicValue = 0.0;
  this->m_nonbasicValueUpToDate = false;
  SPxLPBase<double>::changeLhs(&this->super_SPxLPBase<double>,newLhs,scale);
  SPxLPBase<double>::changeRhs(&this->super_SPxLPBase<double>,newRhs,scale);
  if (NO_PROBLEM < (this->super_SPxBasisBase<double>).thestatus) {
    uVar3 = (ulong)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (0 < (long)uVar3) {
      do {
        uVar1 = uVar3 - 1;
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6b])
                  ((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3 - 1],0,this,uVar1 & 0xffffffff);
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6c])
                  ((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3 - 1],this,uVar1 & 0xffffffff);
        bVar2 = 1 < uVar3;
        uVar3 = uVar1;
      } while (bVar2);
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
    return;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeRange(const VectorBase<R>& newLhs, const VectorBase<R>& newRhs,
                                   bool scale)
{
   // we better recompute the nonbasic value when changing all ranges
   forceRecompNonbasicValue();

   SPxLPBase<R>::changeLhs(newLhs, scale);
   SPxLPBase<R>::changeRhs(newRhs, scale);

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      for(int i = this->nRows() - 1; i >= 0; --i)
      {
         changeLhsStatus(i, this->lhs(i));
         changeRhsStatus(i, this->rhs(i));
      }

      unInit();
   }
}